

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O3

void __thiscall GlobOptBlockData::SetValue(GlobOptBlockData *this,Value *val,Sym *sym)

{
  Sym *value;
  Value **ppVVar1;
  
  value = GlobOpt::SetSymStore(this->globOpt,val->valueInfo,sym);
  if ((value->m_kind == SymKindStack) && (((ulong)value[1]._vptr_Sym & 0x40000) != 0)) {
    SparseArray<Value>::Set(this->globOpt->byteCodeConstantValueArray,value->m_id,val);
    BVSparse<Memory::JitArenaAllocator>::Set
              (this->globOpt->byteCodeConstantValueNumbersBv,val->valueNumber);
    return;
  }
  ppVVar1 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(this->symToValueMap,value);
  *ppVVar1 = val;
  if ((value->m_kind == SymKindStack) && (((ulong)value[1]._vptr_Sym & 0x2000) != 0)) {
    SetChangedSym(this,value->m_id);
    return;
  }
  return;
}

Assistant:

void
GlobOptBlockData::SetValue(Value *val, Sym * sym)
{
    ValueInfo *valueInfo = val->GetValueInfo();

    sym = this->globOpt->SetSymStore(valueInfo, sym);
    bool isStackSym = sym->IsStackSym();

    if (isStackSym && sym->AsStackSym()->IsFromByteCodeConstantTable())
    {
        // Put the constants in a global array. This will minimize the per-block info.
        this->globOpt->byteCodeConstantValueArray->Set(sym->m_id, val);
        this->globOpt->byteCodeConstantValueNumbersBv->Set(val->GetValueNumber());
    }
    else
    {
        this->SetValueToHashTable(this->symToValueMap, val, sym);
        this->SetChangedSym(sym);
    }
}